

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O1

void __thiscall
camera<double>::camera
          (camera<double> *this,point3<double> *from,point3<double> *to,vec3<double> *vup,
          double *fov,double *ar,double *ap,double *focus,double *t0,double *t1)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  memset(this,0,0xa8);
  dVar5 = tan(((*fov * 3.141592653589793) / 180.0) * 0.5);
  dVar1 = *ar;
  dVar10 = from->e[1] - to->e[1];
  dVar11 = from->e[2] - to->e[2];
  dVar13 = from->e[0] - to->e[0];
  dVar6 = dVar11 * dVar11 + dVar13 * dVar13 + dVar10 * dVar10;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  dVar10 = dVar10 * dVar6;
  dVar11 = dVar11 * dVar6;
  dVar13 = dVar13 * dVar6;
  (this->w).e[0] = dVar13;
  (this->w).e[1] = dVar10;
  (this->w).e[2] = dVar11;
  dVar12 = dVar11 * vup->e[1] - dVar10 * vup->e[2];
  dVar11 = dVar13 * vup->e[2] - dVar11 * vup->e[0];
  dVar10 = vup->e[0] * dVar10 - dVar13 * vup->e[1];
  dVar6 = dVar10 * dVar10 + dVar12 * dVar12 + dVar11 * dVar11;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  dVar10 = dVar10 * dVar6;
  dVar12 = dVar12 * dVar6;
  dVar11 = dVar11 * dVar6;
  (this->u).e[0] = dVar12;
  (this->u).e[1] = dVar11;
  (this->u).e[2] = dVar10;
  dVar13 = (this->w).e[1];
  dVar3 = (this->w).e[2];
  dVar6 = (this->w).e[0];
  dVar8 = dVar10 * dVar13 - dVar11 * dVar3;
  dVar9 = dVar12 * dVar3 - dVar10 * dVar6;
  dVar7 = dVar11 * dVar6 - dVar12 * dVar13;
  (this->v).e[0] = dVar8;
  (this->v).e[1] = dVar9;
  (this->v).e[2] = dVar7;
  this->t0_ = *t0;
  this->t1_ = *t1;
  (this->o_).e[2] = from->e[2];
  dVar4 = from->e[1];
  (this->o_).e[0] = from->e[0];
  (this->o_).e[1] = dVar4;
  dVar15 = dVar1 * (dVar5 + dVar5) * *focus;
  dVar11 = dVar15 * dVar11;
  auVar2._8_4_ = SUB84(dVar11,0);
  auVar2._0_8_ = dVar15 * dVar12;
  auVar2._12_4_ = (int)((ulong)dVar11 >> 0x20);
  *(undefined1 (*) [16])(this->hor_).e = auVar2;
  (this->hor_).e[2] = dVar15 * dVar10;
  dVar14 = (dVar5 + dVar5) * *focus;
  dVar8 = dVar14 * dVar8;
  dVar9 = dVar14 * dVar9;
  dVar14 = dVar14 * dVar7;
  (this->ver_).e[0] = dVar8;
  (this->ver_).e[1] = dVar9;
  (this->ver_).e[2] = dVar14;
  dVar4 = (this->o_).e[1];
  dVar1 = (this->o_).e[2];
  dVar5 = *focus;
  (this->llc_).e[0] = (((this->o_).e[0] - dVar15 * dVar12 * 0.5) - dVar8 * 0.5) - dVar5 * dVar6;
  (this->llc_).e[1] = ((dVar4 - dVar11 * 0.5) - dVar9 * 0.5) - dVar5 * dVar13;
  (this->llc_).e[2] = ((dVar1 - dVar15 * dVar10 * 0.5) - dVar14 * 0.5) - dVar3 * dVar5;
  this->r_ = *ap * 0.5;
  return;
}

Assistant:

camera(const point3<T>& from,
         const point3<T>& to,
         const vec3<T>& vup,
         const T& fov,
         const T& ar,
         const T& ap,
         const T& focus,
         const T& t0 = 0,
         const T& t1 = 0) {
    T t = deg_to_rad(fov);
    T h = std::tan(t / static_cast<T>(2));
    T vp_height = static_cast<T>(2.0) * h;
    T vp_width = ar * vp_height;
    // T focus = 1.0;

    w = unit_v<T>(from - to);
    u = unit_v<T>(cross<T>(vup, w));
    v = cross<T>(w, u);

    t0_ = t0;
    t1_ = t1;

    o_ = from;
    hor_ = focus * vp_width * u;
    ver_ = focus * vp_height * v;
    llc_ = o_ - hor_ / static_cast<T>(2.0) - ver_ / static_cast<T>(2.0) -
           focus * w;

    r_ = ap / static_cast<T>(2);
  }